

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

int Aig_ManSeqCleanup(Aig_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  Aig_Obj_t *pObj;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  Aig_ManIncrementTravId(p);
  iVar4 = p->nTravIds;
  p->pConst1->TravId = iVar4;
  iVar3 = p->nRegs;
  if (iVar3 < p->nObjs[2]) {
    pVVar5 = p->vCis;
    uVar10 = pVVar5->nSize;
    uVar14 = 0;
    uVar12 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar12 = uVar14;
    }
    do {
      if (uVar12 == uVar14) goto LAB_00610485;
      *(int *)((long)pVVar5->pArray[uVar14] + 0x20) = iVar4;
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nObjs[2] - (long)iVar3);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  if (p->nRegs < p->nObjs[3]) {
    lVar15 = 0;
    do {
      if (p->vCos->nSize <= lVar15) goto LAB_00610485;
      pvVar1 = p->vCos->pArray[lVar15];
      uVar10 = pVVar5->nCap;
      if (pVVar5->nSize == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar10 * 2;
          if (iVar4 <= (int)uVar10) goto LAB_0060ff4a;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar10 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar10 << 4);
          }
        }
        pVVar5->pArray = ppvVar6;
        pVVar5->nCap = iVar4;
      }
LAB_0060ff4a:
      iVar4 = pVVar5->nSize;
      pVVar5->nSize = iVar4 + 1;
      pVVar5->pArray[iVar4] = pvVar1;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (long)p->nObjs[3] - (long)p->nRegs);
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar3 = 0;
    do {
      uVar10 = (p->nObjs[3] - iVar4) + iVar3;
      if (((((int)uVar10 < 0) || (p->vCos->nSize <= (int)uVar10)) ||
          (uVar13 = (p->nObjs[2] - iVar4) + iVar3, (int)uVar13 < 0)) ||
         (p->vCis->nSize <= (int)uVar13)) goto LAB_00610485;
      *(void **)p->vCis->pArray[uVar13] = p->vCos->pArray[uVar10];
      iVar3 = iVar3 + 1;
      iVar4 = p->nRegs;
    } while (iVar3 < iVar4);
  }
  iVar4 = pVVar5->nSize;
  if (0 < iVar4) {
    lVar15 = 0;
    do {
      Aig_ManSeqCleanup_rec(p,(Aig_Obj_t *)pVVar5->pArray[lVar15],pVVar5);
      lVar15 = lVar15 + 1;
      iVar4 = pVVar5->nSize;
    } while (lVar15 < iVar4);
  }
  if (p->nObjs[3] < iVar4) {
    __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                  ,0xb6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar3 = 0;
    do {
      iVar11 = (p->nObjs[3] - iVar4) + iVar3;
      if (((iVar11 < 0) || (p->vCos->nSize <= iVar11)) ||
         ((uVar10 = (p->nObjs[2] - iVar4) + iVar3, (int)uVar10 < 0 ||
          (p->vCis->nSize <= (int)uVar10)))) {
LAB_00610485:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(undefined8 *)p->vCis->pArray[uVar10] = 0;
      iVar3 = iVar3 + 1;
      iVar4 = p->nRegs;
    } while (iVar3 < iVar4);
  }
  iVar3 = p->nObjs[3];
  if (pVVar5->nSize < iVar3) {
    pVVar2 = p->vFlopNums;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      pVVar7 = p->vCos;
      if (pVVar7->nSize < 1) {
        uVar10 = 0;
      }
      else {
        lVar15 = 0;
        uVar10 = 0;
        do {
          if ((iVar3 - iVar4 <= lVar15) &&
             (*(int *)((long)pVVar7->pArray[lVar15] + 0x20) == p->nTravIds)) {
            uVar12 = (ulong)(uint)(iVar4 - iVar3) + lVar15;
            iVar11 = (int)uVar12;
            if ((iVar11 < 0) || (pVVar2->nSize <= iVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (((int)uVar10 < 0) || (pVVar2->nSize <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar14 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
            pVVar2->pArray[uVar14] = pVVar2->pArray[uVar12 & 0xffffffff];
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar7->nSize);
      }
      if (uVar10 != pVVar5->nSize - (iVar3 - iVar4)) {
        __assert_fail("k == Vec_PtrSize(vNodes) - nTruePos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                      ,200,"int Aig_ManSeqCleanup(Aig_Man_t *)");
      }
      if (pVVar2->nSize < (int)uVar10) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar2->nSize = uVar10;
    }
    iVar4 = p->nObjs[2];
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar3 = 8;
    if (6 < iVar4 - 1U) {
      iVar3 = iVar4;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar3;
    if (iVar3 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar3 << 3);
    }
    pVVar7->pArray = ppvVar6;
    pVVar8 = p->vCis;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        pvVar1 = pVVar8->pArray[lVar15];
        if (*(int *)((long)pvVar1 + 0x20) == p->nTravIds) {
          uVar10 = pVVar7->nCap;
          if (pVVar7->nSize == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar10 * 2;
              if (iVar4 <= (int)uVar10) goto LAB_0061021f;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar10 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar10 << 4);
              }
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = iVar4;
          }
LAB_0061021f:
          iVar4 = pVVar7->nSize;
          pVVar7->nSize = iVar4 + 1;
          pVVar7->pArray[iVar4] = pvVar1;
        }
        else {
          iVar4 = *(int *)((long)pvVar1 + 0x24);
          if (((long)iVar4 < 0) || (p->vObjs->nSize <= iVar4)) goto LAB_006104a4;
          p->vObjs->pArray[iVar4] = (void *)0x0;
        }
        lVar15 = lVar15 + 1;
        pVVar8 = p->vCis;
      } while (lVar15 < pVVar8->nSize);
    }
    iVar4 = p->nObjs[3];
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar3 = 8;
    if (6 < iVar4 - 1U) {
      iVar3 = iVar4;
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar3;
    if (iVar3 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar3 << 3);
    }
    pVVar8->pArray = ppvVar6;
    pVVar9 = p->vCos;
    if (0 < pVVar9->nSize) {
      lVar15 = 0;
      do {
        pObj = (Aig_Obj_t *)pVVar9->pArray[lVar15];
        if (pObj->TravId == p->nTravIds) {
          uVar10 = pVVar8->nCap;
          if (pVVar8->nSize == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar10 * 2;
              if (iVar4 <= (int)uVar10) goto LAB_0061035e;
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar10 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar8->pArray,(ulong)uVar10 << 4);
              }
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = iVar4;
          }
LAB_0061035e:
          iVar4 = pVVar8->nSize;
          pVVar8->nSize = iVar4 + 1;
          pVVar8->pArray[iVar4] = pObj;
        }
        else {
          Aig_ObjDisconnect(p,pObj);
          iVar4 = pObj->Id;
          if (((long)iVar4 < 0) || (p->vObjs->nSize <= iVar4)) {
LAB_006104a4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          p->vObjs->pArray[iVar4] = (void *)0x0;
        }
        lVar15 = lVar15 + 1;
        pVVar9 = p->vCos;
      } while (lVar15 < pVVar9->nSize);
    }
    iVar4 = pVVar5->nSize;
    iVar3 = iVar4 - p->nObjs[3];
    p->nRegs = p->nRegs + iVar3;
    if (pVVar7->nSize != iVar3 + p->nObjs[2]) {
      __assert_fail("Vec_PtrSize(vCis) == nTruePis + p->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                    ,0xe5,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    if (pVVar8->nSize != iVar4) {
      __assert_fail("Vec_PtrSize(vCos) == nTruePos + p->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                    ,0xe6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    pVVar9 = p->vCis;
    if (pVVar9->pArray != (void **)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (void **)0x0;
    }
    if (pVVar9 != (Vec_Ptr_t *)0x0) {
      free(pVVar9);
    }
    p->vCis = pVVar7;
    pVVar7 = p->vCos;
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (void **)0x0;
    }
    if (pVVar7 != (Vec_Ptr_t *)0x0) {
      free(pVVar7);
    }
    p->vCos = pVVar8;
    p->nObjs[2] = p->vCis->nSize;
    p->nObjs[3] = pVVar8->nSize;
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  p->nTruePis = p->nObjs[2] - p->nRegs;
  p->nTruePos = p->nObjs[3] - p->nRegs;
  Aig_ManSetCioIds(p);
  iVar4 = Aig_ManCleanup(p);
  return iVar4;
}

Assistant:

int Aig_ManSeqCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes, * vCis, * vCos;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, nTruePis, nTruePos;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        if ( p->vFlopNums )
        {
            int nTruePos = Aig_ManCoNum(p)-Aig_ManRegNum(p);
            int iNum, k = 0;
            Aig_ManForEachCo( p, pObj, i )
                if ( i >= nTruePos && Aig_ObjIsTravIdCurrent(p, pObj) )
                {
                    iNum = Vec_IntEntry( p->vFlopNums, i - nTruePos );
                    Vec_IntWriteEntry( p->vFlopNums, k++, iNum );
                }
            assert( k == Vec_PtrSize(vNodes) - nTruePos );
            Vec_IntShrink( p->vFlopNums, k );
        }
        // collect new CIs/COs
        vCis = Vec_PtrAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCis, pObj );
            else
            {
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        vCos = Vec_PtrAlloc( Aig_ManCoNum(p) );
        Aig_ManForEachCo( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCos, pObj );
            else
            {
                Aig_ObjDisconnect( p, pObj );
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        // remember the number of true PIs/POs
        nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
        nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
        // set the new number of registers
        p->nRegs -= Aig_ManCoNum(p) - Vec_PtrSize(vNodes);
        // create new PIs/POs
        assert( Vec_PtrSize(vCis) == nTruePis + p->nRegs );
        assert( Vec_PtrSize(vCos) == nTruePos + p->nRegs );
        Vec_PtrFree( p->vCis );    p->vCis = vCis;
        Vec_PtrFree( p->vCos );    p->vCos = vCos;
        p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
        p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
                
    }
    Vec_PtrFree( vNodes );
    p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p); 
    p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p); 
    Aig_ManSetCioIds( p );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}